

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

void nhdp_domain_process_willingness_tlv
               (uint8_t *mprtypes,size_t mprtypes_size,rfc5444_reader_tlvblock_entry *tlv)

{
  list_entity *plVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  
  _flooding_domain._tmp_willingness = '\0';
  for (plVar1 = _domain_list.next; plVar1->prev != _domain_list.prev; plVar1 = plVar1->next) {
    *(undefined1 *)((long)&plVar1[-0x27].prev + 1) = 0;
  }
  if (tlv != (rfc5444_reader_tlvblock_entry *)0x0) {
    uVar4 = *tlv->single_value & 0xf;
    _flooding_domain._tmp_willingness = (uint8_t)uVar4;
    if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2c4,(void *)0x0,0,
               "Received flooding willingness: %u",(ulong)uVar4);
    }
    if (mprtypes_size != 0) {
      sVar5 = 0;
      do {
        plVar1 = &_domain_list;
        do {
          plVar1 = plVar1->next;
          if (plVar1->prev == _domain_list.prev) {
            plVar1 = (list_entity *)0x0;
            goto LAB_0012c2d3;
          }
        } while (*(uint8_t *)((long)&plVar1[-0x27].next + 1) != mprtypes[sVar5]);
        plVar1 = plVar1 + -0x2a;
LAB_0012c2d3:
        if ((plVar1 != (list_entity *)0x0) && (uVar3 = sVar5 + 1 >> 1, uVar3 < tlv->length)) {
          bVar2 = tlv->single_value[uVar3] & 0xf;
          if (((ulong)plVar1[3].next & 0x100000000) == 0) {
            bVar2 = tlv->single_value[uVar3] >> 4;
          }
          *(byte *)((long)&plVar1[3].prev + 1) = bVar2;
          if ((log_global_mask[LOG_NHDP_R] & 1) != 0) {
            oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_R,"src/nhdp/nhdp/nhdp_domain.c",0x2db,(void *)0x0,0
                     ,"Received routing willingness for domain %u: %u",
                     (ulong)*(byte *)((long)&plVar1[3].next + 1),(ulong)bVar2);
          }
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != mprtypes_size);
    }
  }
  return;
}

Assistant:

void
nhdp_domain_process_willingness_tlv(
  uint8_t *mprtypes, size_t mprtypes_size, struct rfc5444_reader_tlvblock_entry *tlv) {
  struct nhdp_domain *domain;
  size_t idx, i;
  uint8_t value;

  _flooding_domain._tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  list_for_each_element(&_domain_list, domain, _node) {
    domain->_tmp_willingness = RFC7181_WILLINGNESS_NEVER;
  }

  if (!tlv) {
    return;
  }

  /* copy flooding willingness */
  _flooding_domain._tmp_willingness = tlv->single_value[0] & RFC7181_WILLINGNESS_MASK;
  OONF_DEBUG(LOG_NHDP_R, "Received flooding willingness: %u", _flooding_domain._tmp_willingness);

  for (i = 0; i < mprtypes_size; i++) {
    domain = nhdp_domain_get_by_ext(mprtypes[i]);
    if (domain == NULL) {
      continue;
    }

    idx = (i + 1) / 2;
    if (idx >= tlv->length) {
      continue;
    }

    value = tlv->single_value[idx];
    if ((domain->index & 1) == 0) {
      value >>= RFC7181_WILLINGNESS_SHIFT;
    }
    else {
      value &= RFC7181_WILLINGNESS_MASK;
    }

    domain->_tmp_willingness = value;

    OONF_DEBUG(LOG_NHDP_R, "Received routing willingness for domain %u: %u", domain->ext, domain->_tmp_willingness);
  }
}